

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O3

bool __thiscall RTIMULSM9DS0::IMUInit(RTIMULSM9DS0 *this)

{
  RTIMUSettings *this_00;
  bool bVar1;
  uchar uVar2;
  char *__format;
  uchar result;
  uchar local_9;
  
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this_00 = (this->super_RTIMU).m_settings;
  this->m_gyroSlaveAddr = this_00->m_I2CSlaveAddress;
  bVar1 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,'\x1e','\x0f','\x01',&local_9,"");
  uVar2 = '\x1d';
  if ((!bVar1) || (uVar2 = '\x1e', local_9 == 'I')) {
    this->m_accelCompassSlaveAddr = uVar2;
  }
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if (((bVar1) &&
      (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_gyroSlaveAddr,'$',0x80,"Failed to boot LSM9DS0"), bVar1))
     && (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_gyroSlaveAddr,'\x0f','\x01',&local_9,
                                   "Failed to read LSM9DS0 gyro id"), bVar1)) {
    if (local_9 != 0xd4) {
      __format = "Incorrect LSM9DS0 gyro id %d\n";
LAB_00119c2a:
      fprintf(_stderr,__format);
      return false;
    }
    bVar1 = setGyroSampleRate(this);
    if (((bVar1) && (bVar1 = setGyroCTRL2(this), bVar1)) &&
       ((bVar1 = setGyroCTRL4(this), bVar1 &&
        (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_accelCompassSlaveAddr,'\x0f','\x01',&local_9,
                                   "Failed to read LSM9DS0 accel/mag id"), bVar1)))) {
      if (local_9 != 'I') {
        __format = "Incorrect LSM9DS0 accel/mag id %d\n";
        goto LAB_00119c2a;
      }
      bVar1 = setAccelCTRL1(this);
      if (((bVar1) && (bVar1 = setAccelCTRL2(this), bVar1)) &&
         ((bVar1 = setCompassCTRL5(this), bVar1 &&
          (((bVar1 = setCompassCTRL6(this), bVar1 &&
            (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                        this->m_accelCompassSlaveAddr,'&','`',
                                        "Failed to set LSM9DS0CTRL7"), bVar1)) &&
           (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_gyroSlaveAddr,'$','\x10',
                                       "Failed to set LSM9DS0 gyro CTRL5"), bVar1)))))) {
        RTIMU::gyroBiasInit(&this->super_RTIMU);
        puts("LSM9DS0 init complete");
        fflush(_stdout);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RTIMULSM9DS0::IMUInit()
{
    unsigned char result;

#ifdef LSM9DS0_CACHE_MODE
    m_firstTime = true;
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif
    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_gyroSlaveAddr = m_settings->m_I2CSlaveAddress;

    // work out accelmag address

    if (m_settings->HALRead(LSM9DS0_ACCELMAG_ADDRESS0, LSM9DS0_WHO_AM_I, 1, &result, "")) {
        if (result == LSM9DS0_ACCELMAG_ID) {
            m_accelCompassSlaveAddr = LSM9DS0_ACCELMAG_ADDRESS0;
        }
    } else {
        m_accelCompassSlaveAddr = LSM9DS0_ACCELMAG_ADDRESS1;
    }

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  Set up the gyro

    if (!m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_CTRL5, 0x80, "Failed to boot LSM9DS0"))
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, LSM9DS0_GYRO_WHO_AM_I, 1, &result, "Failed to read LSM9DS0 gyro id"))
        return false;

    if (result != LSM9DS0_GYRO_ID) {
        HAL_ERROR1("Incorrect LSM9DS0 gyro id %d\n", result);
        return false;
    }

    if (!setGyroSampleRate())
            return false;

    if (!setGyroCTRL2())
            return false;

    if (!setGyroCTRL4())
            return false;

    //  Set up the accel

    if (!m_settings->HALRead(m_accelCompassSlaveAddr, LSM9DS0_WHO_AM_I, 1, &result, "Failed to read LSM9DS0 accel/mag id"))
        return false;

    if (result != LSM9DS0_ACCELMAG_ID) {
        HAL_ERROR1("Incorrect LSM9DS0 accel/mag id %d\n", result);
        return false;
    }

    if (!setAccelCTRL1())
        return false;

    if (!setAccelCTRL2())
        return false;

    if (!setCompassCTRL5())
        return false;

    if (!setCompassCTRL6())
        return false;

    if (!setCompassCTRL7())
        return false;

#ifdef LSM9DS0_CACHE_MODE

    //  turn on gyro fifo

    if (!m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_FIFO_CTRL, 0x3f, "Failed to set LSM9DS0 FIFO mode"))
        return false;
#endif

    if (!setGyroCTRL5())
            return false;

    gyroBiasInit();

    HAL_INFO("LSM9DS0 init complete\n");
    return true;
}